

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::ObjectIntersectorK<4,_true>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  size_t bits;
  ulong uVar11;
  _func_int **pp_Var12;
  undefined4 uVar13;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar14;
  long lVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  AABBNodeMB4D *node1;
  ulong uVar19;
  uint uVar20;
  size_t sVar21;
  NodeRef *pNVar22;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar23;
  undefined1 auVar24 [64];
  vfloat_impl<4> __tmp;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar27;
  float fVar28;
  float fVar32;
  float fVar33;
  undefined1 auVar29 [16];
  float fVar34;
  undefined1 auVar30 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar31;
  vint4 ai_2;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 ai_1;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_ZMM4 [64];
  vint4 ai_3;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  vint4 bi;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  vint4 bi_1;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  vint4 bi_3;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  vint4 ai;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  vint4 bi_2;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 local_17f8 [16];
  undefined1 local_17c8 [16];
  RTCIntersectFunctionNArguments local_17b0;
  Geometry *local_1780;
  undefined8 local_1778;
  RTCIntersectArguments *local_1770;
  undefined1 local_1768 [16];
  undefined1 local_1758 [16];
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16f8;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  sVar21 = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (sVar21 != 8) {
    auVar54 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
    auVar30 = vpcmpeqd_avx((undefined1  [16])valid_i->field_0,auVar54);
    iVar10 = vmovmskps_avx(auVar30);
    uVar11 = CONCAT44((int)((ulong)This->ptr >> 0x20),iVar10);
    if (iVar10 != 0) {
      auVar26 = *(undefined1 (*) [16])(ray + 0x40);
      auVar25._8_4_ = 0x7fffffff;
      auVar25._0_8_ = 0x7fffffff7fffffff;
      auVar25._12_4_ = 0x7fffffff;
      auVar37 = vandps_avx(auVar26,auVar25);
      auVar35._8_4_ = 0x219392ef;
      auVar35._0_8_ = 0x219392ef219392ef;
      auVar35._12_4_ = 0x219392ef;
      auVar37 = vcmpps_avx(auVar37,auVar35,1);
      auVar38 = vblendvps_avx(auVar26,auVar35,auVar37);
      auVar37 = *(undefined1 (*) [16])(ray + 0x50);
      auVar52 = vandps_avx(auVar37,auVar25);
      auVar52 = vcmpps_avx(auVar52,auVar35,1);
      auVar39 = vblendvps_avx(auVar37,auVar35,auVar52);
      auVar52 = *(undefined1 (*) [16])(ray + 0x60);
      auVar25 = vandps_avx(auVar52,auVar25);
      auVar25 = vcmpps_avx(auVar25,auVar35,1);
      auVar25 = vblendvps_avx(auVar52,auVar35,auVar25);
      auVar35 = vrcpps_avx(auVar38);
      fVar2 = auVar35._0_4_;
      auVar29._0_4_ = auVar38._0_4_ * fVar2;
      fVar32 = auVar35._4_4_;
      auVar29._4_4_ = auVar38._4_4_ * fVar32;
      fVar4 = auVar35._8_4_;
      auVar29._8_4_ = auVar38._8_4_ * fVar4;
      fVar7 = auVar35._12_4_;
      auVar29._12_4_ = auVar38._12_4_ * fVar7;
      auVar55._8_4_ = 0x3f800000;
      auVar55._0_8_ = 0x3f8000003f800000;
      auVar55._12_4_ = 0x3f800000;
      auVar35 = vsubps_avx(auVar55,auVar29);
      auVar38 = vrcpps_avx(auVar39);
      fVar3 = auVar38._0_4_;
      auVar36._0_4_ = auVar39._0_4_ * fVar3;
      fVar33 = auVar38._4_4_;
      auVar36._4_4_ = auVar39._4_4_ * fVar33;
      fVar5 = auVar38._8_4_;
      auVar36._8_4_ = auVar39._8_4_ * fVar5;
      fVar8 = auVar38._12_4_;
      auVar36._12_4_ = auVar39._12_4_ * fVar8;
      auVar39 = vsubps_avx(auVar55,auVar36);
      auVar38 = vrcpps_avx(auVar25);
      fVar28 = auVar38._0_4_;
      auVar49._0_4_ = auVar25._0_4_ * fVar28;
      fVar34 = auVar38._4_4_;
      auVar49._4_4_ = auVar25._4_4_ * fVar34;
      fVar6 = auVar38._8_4_;
      auVar49._8_4_ = auVar25._8_4_ * fVar6;
      fVar9 = auVar38._12_4_;
      auVar49._12_4_ = auVar25._12_4_ * fVar9;
      auVar38 = vsubps_avx(auVar55,auVar49);
      auVar29 = ZEXT416(0) << 0x20;
      auVar26 = vcmpps_avx(auVar26,auVar29,1);
      auVar56._8_4_ = 1;
      auVar56._0_8_ = 0x100000001;
      auVar56._12_4_ = 1;
      auVar26 = vandps_avx(auVar56,auVar26);
      auVar37 = vcmpps_avx(auVar37,auVar29,1);
      auVar57._8_4_ = 2;
      auVar57._0_8_ = 0x200000002;
      auVar57._12_4_ = 2;
      auVar37 = vandps_avx(auVar57,auVar37);
      auVar25 = vorps_avx(auVar37,auVar26);
      auVar37 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar29);
      auVar26 = vcmpps_avx(auVar52,auVar29,1);
      auVar52._8_4_ = 4;
      auVar52._0_8_ = 0x400000004;
      auVar52._12_4_ = 4;
      auVar26 = vandps_avx(auVar26,auVar52);
      auVar58 = ZEXT1664(*(undefined1 (*) [16])ray);
      auVar59 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x10));
      auVar54 = vpor_avx(auVar26,auVar30 ^ auVar54);
      auVar60 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x20));
      local_17c8 = vpor_avx(auVar54,auVar25);
      do {
        lVar15 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
          }
        }
        uVar13 = *(undefined4 *)(local_17c8 + lVar15 * 4);
        auVar54._4_4_ = uVar13;
        auVar54._0_4_ = uVar13;
        auVar54._8_4_ = uVar13;
        auVar54._12_4_ = uVar13;
        auVar54 = vpcmpeqd_avx(auVar54,local_17c8);
        uVar13 = vmovmskps_avx(auVar54);
        uVar11 = uVar11 & ~CONCAT44((int)((ulong)lVar15 >> 0x20),uVar13);
      } while (uVar11 != 0);
      local_17c8 = vpcmpeqd_avx(local_17c8,local_17c8);
      auVar30 = vpcmpeqd_avx(local_17c8,(undefined1  [16])valid_i->field_0);
      auVar54 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x20);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      local_16f8.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar54,auVar30);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = sVar21;
      stack_near[1].field_0 = local_16f8;
      if (sVar21 != 0xfffffffffffffff8) {
        local_1708 = fVar2 + auVar35._0_4_ * fVar2;
        fStack_1704 = fVar32 + auVar35._4_4_ * fVar32;
        fStack_1700 = fVar4 + auVar35._8_4_ * fVar4;
        fStack_16fc = fVar7 + auVar35._12_4_ * fVar7;
        local_1718 = fVar3 + auVar39._0_4_ * fVar3;
        fStack_1714 = fVar33 + auVar39._4_4_ * fVar33;
        fStack_1710 = fVar5 + auVar39._8_4_ * fVar5;
        fStack_170c = fVar8 + auVar39._12_4_ * fVar8;
        local_1728 = fVar28 + auVar38._0_4_ * fVar28;
        fStack_1724 = fVar34 + auVar38._4_4_ * fVar34;
        fStack_1720 = fVar6 + auVar38._8_4_ * fVar6;
        fStack_171c = fVar9 + auVar38._12_4_ * fVar9;
        pNVar22 = stack_node + 1;
        auVar26._8_4_ = 0xff800000;
        auVar26._0_8_ = 0xff800000ff800000;
        auVar26._12_4_ = 0xff800000;
        local_17f8 = vblendvps_avx(auVar26,auVar37,auVar30);
        paVar14 = &stack_near[2].field_0;
        local_1748 = *(undefined1 (*) [16])ray;
        local_1758 = *(undefined1 (*) [16])(ray + 0x10);
        local_1768 = *(undefined1 (*) [16])(ray + 0x20);
        do {
          paVar1 = paVar14 + -1;
          auVar24 = ZEXT1664((undefined1  [16])*paVar1);
          paVar14 = paVar14 + -1;
          auVar54 = vcmpps_avx((undefined1  [16])*paVar1,local_17f8,1);
          if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar54[0xf] < '\0') {
            while( true ) {
              uVar20 = (uint)sVar21;
              if ((sVar21 & 8) != 0) break;
              uVar19 = sVar21 & 0xfffffffffffffff0;
              auVar54 = vcmpps_avx(local_17f8,auVar24._0_16_,6);
              uVar11 = 0;
              auVar24 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              lVar15 = -0x10;
              sVar21 = 8;
              do {
                sVar17 = *(size_t *)(uVar19 + 0x20 + lVar15 * 2);
                if (sVar17 == 8) break;
                fVar2 = *(float *)(uVar19 + 0x90 + lVar15);
                fVar3 = *(float *)(uVar19 + 0x30 + lVar15);
                auVar30 = *(undefined1 (*) [16])(ray + 0x70);
                fVar28 = auVar30._0_4_;
                fVar32 = auVar30._4_4_;
                fVar33 = auVar30._8_4_;
                fVar34 = auVar30._12_4_;
                auVar37._0_4_ = fVar28 * fVar2 + fVar3;
                auVar37._4_4_ = fVar32 * fVar2 + fVar3;
                auVar37._8_4_ = fVar33 * fVar2 + fVar3;
                auVar37._12_4_ = fVar34 * fVar2 + fVar3;
                fVar2 = *(float *)(uVar19 + 0xb0 + lVar15);
                fVar3 = *(float *)(uVar19 + 0x50 + lVar15);
                auVar38._0_4_ = fVar28 * fVar2 + fVar3;
                auVar38._4_4_ = fVar32 * fVar2 + fVar3;
                auVar38._8_4_ = fVar33 * fVar2 + fVar3;
                auVar38._12_4_ = fVar34 * fVar2 + fVar3;
                fVar2 = *(float *)(uVar19 + 0xd0 + lVar15);
                fVar3 = *(float *)(uVar19 + 0x70 + lVar15);
                auVar41._0_4_ = fVar28 * fVar2 + fVar3;
                auVar41._4_4_ = fVar32 * fVar2 + fVar3;
                auVar41._8_4_ = fVar33 * fVar2 + fVar3;
                auVar41._12_4_ = fVar34 * fVar2 + fVar3;
                fVar2 = *(float *)(uVar19 + 0xa0 + lVar15);
                fVar3 = *(float *)(uVar19 + 0x40 + lVar15);
                auVar44._0_4_ = fVar28 * fVar2 + fVar3;
                auVar44._4_4_ = fVar32 * fVar2 + fVar3;
                auVar44._8_4_ = fVar33 * fVar2 + fVar3;
                auVar44._12_4_ = fVar34 * fVar2 + fVar3;
                fVar2 = *(float *)(uVar19 + 0xc0 + lVar15);
                fVar3 = *(float *)(uVar19 + 0x60 + lVar15);
                auVar47._0_4_ = fVar3 + fVar28 * fVar2;
                auVar47._4_4_ = fVar3 + fVar32 * fVar2;
                auVar47._8_4_ = fVar3 + fVar33 * fVar2;
                auVar47._12_4_ = fVar3 + fVar34 * fVar2;
                fVar2 = *(float *)(uVar19 + 0xe0 + lVar15);
                fVar3 = *(float *)(uVar19 + 0x80 + lVar15);
                auVar50._0_4_ = fVar2 * fVar28 + fVar3;
                auVar50._4_4_ = fVar2 * fVar32 + fVar3;
                auVar50._8_4_ = fVar2 * fVar33 + fVar3;
                auVar50._12_4_ = fVar2 * fVar34 + fVar3;
                auVar26 = vsubps_avx(auVar37,auVar58._0_16_);
                auVar53._0_4_ = local_1708 * auVar26._0_4_;
                auVar53._4_4_ = fStack_1704 * auVar26._4_4_;
                auVar53._8_4_ = fStack_1700 * auVar26._8_4_;
                auVar53._12_4_ = fStack_16fc * auVar26._12_4_;
                auVar26 = vsubps_avx(auVar38,auVar59._0_16_);
                auVar39._0_4_ = local_1718 * auVar26._0_4_;
                auVar39._4_4_ = fStack_1714 * auVar26._4_4_;
                auVar39._8_4_ = fStack_1710 * auVar26._8_4_;
                auVar39._12_4_ = fStack_170c * auVar26._12_4_;
                auVar26 = vsubps_avx(auVar41,auVar60._0_16_);
                auVar42._0_4_ = local_1728 * auVar26._0_4_;
                auVar42._4_4_ = fStack_1724 * auVar26._4_4_;
                auVar42._8_4_ = fStack_1720 * auVar26._8_4_;
                auVar42._12_4_ = fStack_171c * auVar26._12_4_;
                auVar26 = vsubps_avx(auVar44,auVar58._0_16_);
                auVar45._0_4_ = local_1708 * auVar26._0_4_;
                auVar45._4_4_ = fStack_1704 * auVar26._4_4_;
                auVar45._8_4_ = fStack_1700 * auVar26._8_4_;
                auVar45._12_4_ = fStack_16fc * auVar26._12_4_;
                auVar26 = vsubps_avx(auVar47,auVar59._0_16_);
                auVar48._0_4_ = local_1718 * auVar26._0_4_;
                auVar48._4_4_ = fStack_1714 * auVar26._4_4_;
                auVar48._8_4_ = fStack_1710 * auVar26._8_4_;
                auVar48._12_4_ = fStack_170c * auVar26._12_4_;
                auVar26 = vsubps_avx(auVar50,auVar60._0_16_);
                auVar51._0_4_ = local_1728 * auVar26._0_4_;
                auVar51._4_4_ = fStack_1724 * auVar26._4_4_;
                auVar51._8_4_ = fStack_1720 * auVar26._8_4_;
                auVar51._12_4_ = fStack_171c * auVar26._12_4_;
                auVar26 = vpminsd_avx(auVar53,auVar45);
                auVar37 = vpminsd_avx(auVar39,auVar48);
                auVar26 = vpmaxsd_avx(auVar26,auVar37);
                auVar37 = vpminsd_avx(auVar42,auVar51);
                auVar26 = vpmaxsd_avx(auVar26,auVar37);
                auVar37 = vpmaxsd_avx(auVar53,auVar45);
                auVar52 = vpmaxsd_avx(auVar39,auVar48);
                auVar52 = vpminsd_avx(auVar37,auVar52);
                auVar37 = vpmaxsd_avx(auVar42,auVar51);
                auVar37 = vpminsd_avx(auVar37,local_17f8);
                auVar52 = vpminsd_avx(auVar52,auVar37);
                auVar37 = vpmaxsd_avx(auVar26,(undefined1  [16])local_16f8);
                if ((uVar20 & 7) == 6) {
                  auVar37 = vcmpps_avx(auVar37,auVar52,2);
                  uVar13 = *(undefined4 *)(uVar19 + 0xf0 + lVar15);
                  auVar43._4_4_ = uVar13;
                  auVar43._0_4_ = uVar13;
                  auVar43._8_4_ = uVar13;
                  auVar43._12_4_ = uVar13;
                  auVar52 = vcmpps_avx(auVar43,auVar30,2);
                  uVar13 = *(undefined4 *)(uVar19 + 0x100 + lVar15);
                  auVar46._4_4_ = uVar13;
                  auVar46._0_4_ = uVar13;
                  auVar46._8_4_ = uVar13;
                  auVar46._12_4_ = uVar13;
                  auVar30 = vcmpps_avx(auVar30,auVar46,1);
                  auVar30 = vandps_avx(auVar52,auVar30);
                  auVar30 = vandps_avx(auVar30,auVar37);
                }
                else {
                  auVar30 = vcmpps_avx(auVar37,auVar52,2);
                }
                auVar30 = vandps_avx(auVar30,auVar54);
                auVar30 = vpslld_avx(auVar30,0x1f);
                if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar30[0xf] < '\0') {
                  auVar40._8_4_ = 0x7f800000;
                  auVar40._0_8_ = 0x7f8000007f800000;
                  auVar40._12_4_ = 0x7f800000;
                  aVar31 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vblendvps_avx(auVar40,auVar26,auVar30);
                  aVar23 = auVar24._0_16_;
                  auVar30 = vcmpps_avx((undefined1  [16])aVar31,(undefined1  [16])aVar23,1);
                  sVar16 = sVar21;
                  sVar18 = sVar17;
                  aVar27 = aVar31;
                  if (((((auVar30 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                        (auVar30 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar30 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       -1 < auVar30[0xf]) ||
                     (sVar16 = sVar17, sVar18 = sVar21, aVar27 = aVar23, aVar23 = aVar31,
                     sVar21 != 8)) {
                    aVar31 = aVar23;
                    uVar11 = uVar11 + 1;
                    pNVar22->ptr = sVar18;
                    pNVar22 = pNVar22 + 1;
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar14->v = aVar27;
                    paVar14 = paVar14 + 1;
                    sVar17 = sVar16;
                  }
                  auVar24 = ZEXT1664((undefined1  [16])aVar31);
                  sVar21 = sVar17;
                }
                lVar15 = lVar15 + 4;
              } while (lVar15 != 0);
              if (sVar21 == 8) goto LAB_003069f6;
              if (1 < uVar11) {
                aVar31 = paVar14[-2];
                aVar27 = paVar14[-1];
                auVar54 = vcmpps_avx((undefined1  [16])aVar31,(undefined1  [16])aVar27,1);
                aVar23 = aVar27;
                if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar54[0xf] < '\0') {
                  paVar14[-2] = aVar27;
                  paVar14[-1] = aVar31;
                  auVar54 = vpermilps_avx(*(undefined1 (*) [16])(pNVar22 + -2),0x4e);
                  *(undefined1 (*) [16])(pNVar22 + -2) = auVar54;
                  aVar23 = aVar31;
                  aVar31 = aVar27;
                }
                if (uVar11 != 2) {
                  aVar27 = paVar14[-3];
                  auVar54 = vcmpps_avx((undefined1  [16])aVar27,(undefined1  [16])aVar23,1);
                  if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar54[0xf] < '\0') {
                    paVar14[-3] = aVar23;
                    paVar14[-1] = aVar27;
                    sVar17 = pNVar22[-3].ptr;
                    pNVar22[-3].ptr = pNVar22[-1].ptr;
                    pNVar22[-1].ptr = sVar17;
                    aVar27 = aVar23;
                  }
                  auVar54 = vcmpps_avx((undefined1  [16])aVar27,(undefined1  [16])aVar31,1);
                  if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar54[0xf] < '\0') {
                    paVar14[-3] = aVar31;
                    paVar14[-2] = aVar27;
                    auVar54 = vpermilps_avx(*(undefined1 (*) [16])(pNVar22 + -3),0x4e);
                    *(undefined1 (*) [16])(pNVar22 + -3) = auVar54;
                  }
                }
              }
            }
            if (sVar21 == 0xfffffffffffffff8) {
              return;
            }
            auVar54 = vcmpps_avx(local_17f8,auVar24._0_16_,6);
            auVar24 = ZEXT1664(auVar54);
            if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar54[0xf] < '\0') {
              uVar11 = (ulong)(uVar20 & 0xf);
              if (uVar11 != 8) {
                lVar15 = 0;
                local_1738 = auVar54;
                do {
                  local_17b0.geomID = *(uint *)((sVar21 & 0xfffffffffffffff0) + lVar15 * 8);
                  local_1780 = (context->scene->geometries).items[local_17b0.geomID].ptr;
                  uVar20 = local_1780->mask;
                  auVar30._4_4_ = uVar20;
                  auVar30._0_4_ = uVar20;
                  auVar30._8_4_ = uVar20;
                  auVar30._12_4_ = uVar20;
                  auVar54 = vandps_avx(auVar30,*(undefined1 (*) [16])(ray + 0x90));
                  auVar54 = vpcmpeqd_avx(auVar54,_DAT_01f7aa10);
                  auVar30 = auVar24._0_16_ & ~auVar54;
                  if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar30[0xf] < '\0') {
                    mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                   vandnps_avx(auVar54,auVar24._0_16_);
                    local_17b0.primID = *(uint *)((sVar21 & 0xfffffffffffffff0) + 4 + lVar15 * 8);
                    local_17b0.valid = (int *)&mask;
                    local_17b0.geometryUserPtr = local_1780->userPtr;
                    local_17b0.context = context->user;
                    local_17b0.N = 4;
                    local_1778 = 0;
                    local_1770 = context->args;
                    pp_Var12 = (_func_int **)local_1770->intersect;
                    if (pp_Var12 == (_func_int **)0x0) {
                      pp_Var12 = local_1780[1].super_RefCount._vptr_RefCount;
                    }
                    local_17b0.rayhit = (RTCRayHitN *)ray;
                    (*(code *)pp_Var12)(&local_17b0);
                    auVar58 = ZEXT1664(local_1748);
                    auVar59 = ZEXT1664(local_1758);
                    auVar60 = ZEXT1664(local_1768);
                    auVar24 = ZEXT1664(local_1738);
                  }
                  auVar54 = auVar24._0_16_;
                  lVar15 = lVar15 + 1;
                } while (uVar11 - 8 != lVar15);
              }
              local_17f8 = vblendvps_avx(local_17f8,*(undefined1 (*) [16])(ray + 0x80),auVar54);
            }
          }
LAB_003069f6:
          sVar21 = pNVar22[-1].ptr;
          pNVar22 = pNVar22 + -1;
        } while (sVar21 != 0xfffffffffffffff8);
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }